

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  CURLcode CVar1;
  _Bool local_41;
  Curl_easy *local_40;
  h1_tunnel_state_conflict *ts;
  _Bool *p_Stack_30;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *pCStack_20;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_40 = (Curl_easy *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    p_Stack_30 = done;
    done_local._7_1_ = blocking;
    pCStack_20 = data;
    data_local = (Curl_easy *)cf;
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    ts._4_4_ = (**(code **)(*(long *)data_local->id + 0x18))
                         (data_local->id,pCStack_20,done_local._7_1_ & 1,p_Stack_30);
    cf_local._4_4_ = ts._4_4_;
    if ((ts._4_4_ == CURLE_OK) && ((*p_Stack_30 & 1U) != 0)) {
      *p_Stack_30 = false;
      if (local_40 == (Curl_easy *)0x0) {
        CVar1 = tunnel_init((Curl_cfilter *)data_local,pCStack_20,
                            (h1_tunnel_state_conflict **)&local_40);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        data_local->next = local_40;
      }
      ts._4_4_ = 0;
      ts._4_4_ = H1_CONNECT((Curl_cfilter *)data_local,pCStack_20,
                            (h1_tunnel_state_conflict *)local_40);
      if (ts._4_4_ == CURLE_OK) {
        (*Curl_cfree)((pCStack_20->state).aptr.proxyuserpwd);
        (pCStack_20->state).aptr.proxyuserpwd = (char *)0x0;
      }
      local_41 = false;
      if (ts._4_4_ == CURLE_OK) {
        local_41 = tunnel_is_established((h1_tunnel_state_conflict *)data_local->next);
      }
      *p_Stack_30 = local_41;
      if ((*p_Stack_30 & 1U) != 0) {
        *(byte *)((long)&data_local->conn + 4) = *(byte *)((long)&data_local->conn + 4) & 0xfe | 1;
        *(ushort *)&(pCStack_20->req).field_0xbb =
             *(ushort *)&(pCStack_20->req).field_0xbb & 0xfffe | 1;
        (pCStack_20->req).bytecount = 0;
        *(ushort *)&(pCStack_20->req).field_0xbb = *(ushort *)&(pCStack_20->req).field_0xbb & 0xffdf
        ;
        Curl_client_cleanup(pCStack_20);
        Curl_pgrsSetUploadCounter(pCStack_20,0);
        Curl_pgrsSetDownloadCounter(pCStack_20,0);
        tunnel_free((Curl_cfilter *)data_local,pCStack_20);
      }
      cf_local._4_4_ = ts._4_4_;
    }
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* Restore `data->req` fields that may habe been touched */
    data->req.header = TRUE; /* assume header */
    data->req.bytecount = 0;
    data->req.ignorebody = FALSE;
    Curl_client_cleanup(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}